

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackTraceTest.cpp
# Opt level: O0

void __thiscall
StackTraceTest_moveAssignment_Test::TestBody(StackTraceTest_moveAssignment_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char *in_R9;
  string local_f0;
  AssertHelper local_d0;
  Message local_c8;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_90;
  Message local_88;
  undefined1 local_80 [8];
  AssertionResult gtest_ar__1;
  StackTrace other;
  AssertHelper local_48;
  Message local_40 [3];
  undefined1 local_28 [8];
  AssertionResult gtest_ar_;
  StackTrace frames;
  StackTraceTest_moveAssignment_Test *this_local;
  
  cppassert::internal::StackTrace::getStackTrace();
  sVar2 = cppassert::internal::StackTrace::size((StackTrace *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_28,sVar2 != 0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_28);
  if (!bVar1) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&other,(internal *)local_28,(AssertionResult *)"frames.size()>0","false",
               "true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/StackTraceTest.cpp"
               ,0x12,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&other);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_28);
  cppassert::internal::StackTrace::getStackTrace();
  sVar2 = cppassert::internal::StackTrace::size((StackTrace *)&gtest_ar__1.message_);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_80,sVar2 != 0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_80);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_80,
               (AssertionResult *)"other.size()>0","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/StackTraceTest.cpp"
               ,0x14,pcVar3);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_80);
  cppassert::internal::StackTrace::operator=
            ((StackTrace *)&gtest_ar__1.message_,(StackTrace *)&gtest_ar_.message_);
  sVar2 = cppassert::internal::StackTrace::size((StackTrace *)&gtest_ar__1.message_);
  testing::AssertionResult::AssertionResult((AssertionResult *)local_c0,sVar2 != 0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar1) {
    testing::Message::Message(&local_c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f0,(internal *)local_c0,(AssertionResult *)"other.size()>0","false","true",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/DariuszOstolski[P]cppassert/tests/StackTraceTest.cpp"
               ,0x16,pcVar3);
    testing::internal::AssertHelper::operator=(&local_d0,&local_c8);
    testing::internal::AssertHelper::~AssertHelper(&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    testing::Message::~Message(&local_c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  cppassert::internal::StackTrace::~StackTrace((StackTrace *)&gtest_ar__1.message_);
  cppassert::internal::StackTrace::~StackTrace((StackTrace *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(StackTraceTest, moveAssignment)
{
    StackTrace frames = StackTrace::getStackTrace();
    EXPECT_TRUE(frames.size()>0);
    StackTrace other = StackTrace::getStackTrace();
    EXPECT_TRUE(other.size()>0);
    other = std::move(frames);
    EXPECT_TRUE(other.size()>0);
}